

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Matrix * MatrixMultiply(Matrix left,Matrix right)

{
  Matrix *in_RDI;
  float in_stack_00000008;
  float in_stack_0000000c;
  Matrix *result;
  
  memset(in_RDI,0,0x40);
  in_RDI->m0 = left.m10 * right.m4 +
               left.m9 * right.m0 + in_stack_00000008 * left.m11 + left.m8 * left.m15;
  in_RDI->m1 = left.m10 * right.m5 +
               left.m9 * right.m1 + in_stack_00000008 * right.m8 + left.m8 * right.m12;
  in_RDI->m2 = left.m10 * right.m6 +
               left.m9 * right.m2 + in_stack_00000008 * right.m9 + left.m8 * right.m13;
  in_RDI->m3 = left.m10 * right.m7 +
               left.m9 * right.m3 + in_stack_00000008 * right.m10 + left.m8 * right.m14;
  in_RDI->m4 = left.m14 * right.m4 +
               left.m13 * right.m0 + in_stack_0000000c * left.m11 + left.m12 * left.m15;
  in_RDI->m5 = left.m14 * right.m5 +
               left.m13 * right.m1 + in_stack_0000000c * right.m8 + left.m12 * right.m12;
  in_RDI->m6 = left.m14 * right.m6 +
               left.m13 * right.m2 + in_stack_0000000c * right.m9 + left.m12 * right.m13;
  in_RDI->m7 = left.m14 * right.m7 +
               left.m13 * right.m3 + in_stack_0000000c * right.m10 + left.m12 * right.m14;
  in_RDI->m8 = left.m3 * right.m4 + left.m2 * right.m0 + left.m0 * left.m11 + left.m1 * left.m15;
  in_RDI->m9 = left.m3 * right.m5 + left.m2 * right.m1 + left.m0 * right.m8 + left.m1 * right.m12;
  in_RDI->m10 = left.m3 * right.m6 + left.m2 * right.m2 + left.m0 * right.m9 + left.m1 * right.m13;
  in_RDI->m11 = left.m3 * right.m7 + left.m2 * right.m3 + left.m0 * right.m10 + left.m1 * right.m14;
  in_RDI->m12 = left.m7 * right.m4 + left.m6 * right.m0 + left.m4 * left.m11 + left.m5 * left.m15;
  in_RDI->m13 = left.m7 * right.m5 + left.m6 * right.m1 + left.m4 * right.m8 + left.m5 * right.m12;
  in_RDI->m14 = left.m7 * right.m6 + left.m6 * right.m2 + left.m4 * right.m9 + left.m5 * right.m13;
  in_RDI->m15 = left.m7 * right.m7 + left.m6 * right.m3 + left.m4 * right.m10 + left.m5 * right.m14;
  return in_RDI;
}

Assistant:

RMDEF Matrix MatrixMultiply(Matrix left, Matrix right)
{
    Matrix result = { 0 };

    result.m0 = left.m0*right.m0 + left.m1*right.m4 + left.m2*right.m8 + left.m3*right.m12;
    result.m1 = left.m0*right.m1 + left.m1*right.m5 + left.m2*right.m9 + left.m3*right.m13;
    result.m2 = left.m0*right.m2 + left.m1*right.m6 + left.m2*right.m10 + left.m3*right.m14;
    result.m3 = left.m0*right.m3 + left.m1*right.m7 + left.m2*right.m11 + left.m3*right.m15;
    result.m4 = left.m4*right.m0 + left.m5*right.m4 + left.m6*right.m8 + left.m7*right.m12;
    result.m5 = left.m4*right.m1 + left.m5*right.m5 + left.m6*right.m9 + left.m7*right.m13;
    result.m6 = left.m4*right.m2 + left.m5*right.m6 + left.m6*right.m10 + left.m7*right.m14;
    result.m7 = left.m4*right.m3 + left.m5*right.m7 + left.m6*right.m11 + left.m7*right.m15;
    result.m8 = left.m8*right.m0 + left.m9*right.m4 + left.m10*right.m8 + left.m11*right.m12;
    result.m9 = left.m8*right.m1 + left.m9*right.m5 + left.m10*right.m9 + left.m11*right.m13;
    result.m10 = left.m8*right.m2 + left.m9*right.m6 + left.m10*right.m10 + left.m11*right.m14;
    result.m11 = left.m8*right.m3 + left.m9*right.m7 + left.m10*right.m11 + left.m11*right.m15;
    result.m12 = left.m12*right.m0 + left.m13*right.m4 + left.m14*right.m8 + left.m15*right.m12;
    result.m13 = left.m12*right.m1 + left.m13*right.m5 + left.m14*right.m9 + left.m15*right.m13;
    result.m14 = left.m12*right.m2 + left.m13*right.m6 + left.m14*right.m10 + left.m15*right.m14;
    result.m15 = left.m12*right.m3 + left.m13*right.m7 + left.m14*right.m11 + left.m15*right.m15;

    return result;
}